

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeerGateways.hpp
# Opt level: O2

void __thiscall
ableton::discovery::
PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::enable(PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
         *this,bool bEnable)

{
  shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>_>
  pScanner;
  shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>
  pCallback;
  __shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  local_68;
  __shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  local_58;
  anon_class_40_3_15bd51eb_for_handler_ local_48;
  
  std::
  __shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_58,
                 (__shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
                  *)this);
  std::
  __shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_68,
                 &(this->mpScanner).
                  super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
                );
  if ((local_58._M_ptr != (element_type *)0x0) && (local_68._M_ptr != (element_type *)0x0)) {
    std::
    __shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback,_(__gnu_cxx::_Lock_policy)2>
                    *)&local_48,&local_58);
    std::
    __shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_48.pScanner.
                    super___shared_ptr<ableton::discovery::InterfaceScanner<std::shared_ptr<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,_ableton::link::GhostXForm>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::GatewayFactory,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::Callback>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>,_(__gnu_cxx::_Lock_policy)2>
                   ,&local_68);
    local_48.bEnable = bEnable;
    ableton::platforms::asio::
    Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
    async<ableton::discovery::PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::enable(bool)::_lambda()_1_>
              ((Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *)
               &this->mIo,&local_48);
    PeerGateways<std::pair<ableton::link::NodeState,ableton::link::GhostXForm>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::GatewayFactory,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>
    ::enable(bool)::{lambda()#1}::~enable((_lambda___1_ *)&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

void enable(const bool bEnable)
  {
    auto pCallback = mpScannerCallback;
    auto pScanner = mpScanner;

    if (pCallback && pScanner)
    {
      mIo->async([pCallback, pScanner, bEnable] {
        pCallback->mGateways.clear();
        pScanner->enable(bEnable);
      });
    }
  }